

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt_env_infrastructure.cpp
# Opt level: O0

void __thiscall
so_5::env_infrastructures::default_mt::impl::coop_repo_t::coop_repo_t
          (coop_repo_t *this,environment_t *env,coop_listener_unique_ptr_t *coop_listener)

{
  unique_ptr<so_5::coop_listener_t,_std::default_delete<so_5::coop_listener_t>_> local_28;
  coop_listener_unique_ptr_t *local_20;
  coop_listener_unique_ptr_t *coop_listener_local;
  environment_t *env_local;
  coop_repo_t *this_local;
  
  local_20 = coop_listener;
  coop_listener_local = (coop_listener_unique_ptr_t *)env;
  env_local = (environment_t *)this;
  std::unique_ptr<so_5::coop_listener_t,_std::default_delete<so_5::coop_listener_t>_>::unique_ptr
            (&local_28,coop_listener);
  so_5::impl::coop_repository_basis_t::coop_repository_basis_t
            (&this->super_coop_repository_basis_t,env,&local_28);
  std::unique_ptr<so_5::coop_listener_t,_std::default_delete<so_5::coop_listener_t>_>::~unique_ptr
            (&local_28);
  std::condition_variable::condition_variable(&this->m_deregistration_started_cond);
  std::condition_variable::condition_variable(&this->m_deregistration_finished_cond);
  intrusive_ptr_t<so_5::abstract_message_chain_t>::intrusive_ptr_t(&this->m_final_dereg_chain);
  std::thread::thread(&this->m_final_dereg_thread);
  return;
}

Assistant:

coop_repo_t::coop_repo_t(
	environment_t & env,
	coop_listener_unique_ptr_t coop_listener )
	:	coop_repository_basis_t( env, std::move(coop_listener) )
	{}